

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

ulong __thiscall CVmObjString::rebuild_image(CVmObjString *this,char *buf,ulong buflen)

{
  size_t sVar1;
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t copy_size;
  
  sVar1 = vmb_get_len((char *)0x228b36);
  __n = sVar1 + 2;
  if (__n <= in_RDX) {
    memcpy(in_RSI,*(void **)(in_RDI + 8),__n);
  }
  return __n;
}

Assistant:

ulong CVmObjString::rebuild_image(VMG_ char *buf, ulong buflen)
{
    size_t copy_size;

    /* calculate how much space we need to store the data */
    copy_size = vmb_get_len(ext_) + VMB_LEN;

    /* make sure we have room for our data */
    if (copy_size > buflen)
        return copy_size;

    /* copy the data */
    memcpy(buf, ext_, copy_size);

    /* return the size */
    return copy_size;
}